

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeSetJacTimesRhsFn(void *cvode_mem,CVRhsFn jtimesRhsFn)

{
  int iVar1;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacTimesRhsFn",&cv_mem,&cvls_mem);
  if (iVar1 == 0) {
    if (cvls_mem->jtimesDQ == 0) {
      iVar1 = -3;
      cvProcessError(cv_mem,-3,0x225,"CVodeSetJacTimesRhsFn",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                     ,"Internal finite-difference Jacobian-vector product is disabled.");
    }
    else {
      if (jtimesRhsFn == (CVRhsFn)0x0) {
        cvls_mem->jt_f = cv_mem->cv_f;
      }
      else {
        cvls_mem->jt_f = jtimesRhsFn;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetJacTimesRhsFn(void* cvode_mem, CVRhsFn jtimesRhsFn)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(cvls_mem->jtimesDQ))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (CVLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) { cvls_mem->jt_f = jtimesRhsFn; }
  else { cvls_mem->jt_f = cv_mem->cv_f; }

  return (CVLS_SUCCESS);
}